

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O2

type __thiscall
VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
          (VTKPointDescriptor<MercuryParticle<2UL>_> *this,string *name,
          offset_in_MercuryParticle<2UL>_to_unknown m,bool isPrimary)

{
  VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]> *this_00;
  string local_50;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *data;
  
  this_00 = (VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]> *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Detail::VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]>::VTKPointDescriptorEntryImpl
            (this_00,&local_50,m,3);
  std::__cxx11::string::~string((string *)&local_50);
  data = (VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)this_00;
  std::
  vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
  ::push_back(&this->entries_,&data);
  if (isPrimary) {
    this->positionEntry_ =
         (this->entries_).
         super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
  }
  return this;
}

Assistant:

typename std::enable_if<std::is_array<DATATYPE>::value, VTKPointDescriptor&>::type
     addProperty(std::string name, DATATYPE T::*m, bool isPrimary = false)
  {
    Detail::VTKPointDescriptorEntry<T> * data
       = new Detail::VTKPointDescriptorEntryImpl<T,DATATYPE>(name, m, std::extent<DATATYPE>::value);
    entries_.push_back(data);
    if (isPrimary)
      positionEntry_ = entries_.back();

    return *this;
  }